

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_ObjLabelTfo(Acb_Ntk_t *p,int Root,int nTfoLevMax,int nFanMax,int fDelay)

{
  int iVar1;
  
  Acb_NtkIncTravId(p);
  Acb_NtkIncTravId(p);
  Acb_NtkIncTravId(p);
  iVar1 = Acb_ObjTravIdDiff(p,Root);
  if (2 < iVar1) {
    iVar1 = Acb_ObjLabelTfo_rec(p,Root,nTfoLevMax,nFanMax,fDelay);
    return iVar1;
  }
  __assert_fail("Acb_ObjTravIdDiff(p, Root) > 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,600,"int Acb_ObjLabelTfo(Acb_Ntk_t *, int, int, int, int)");
}

Assistant:

int Acb_ObjLabelTfo( Acb_Ntk_t * p, int Root, int nTfoLevMax, int nFanMax, int fDelay )
{
    Acb_NtkIncTravId( p ); // none  (2)    marked (3)  unmarked (4)
    Acb_NtkIncTravId( p ); // root  (1)
    Acb_NtkIncTravId( p ); // inner (0)
    assert( Acb_ObjTravIdDiff(p, Root) > 2 );
    return Acb_ObjLabelTfo_rec( p, Root, nTfoLevMax, nFanMax, fDelay );
}